

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_storage.cpp
# Opt level: O0

void __thiscall libtorrent::aux::posix_storage::posix_storage(posix_storage *this,storage_params *p)

{
  difference_type in_RCX;
  span<const_char> in;
  undefined1 local_80 [16];
  pointer local_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  storage_params *local_18;
  storage_params *p_local;
  posix_storage *this_local;
  
  this->m_files = p->files;
  local_18 = p;
  p_local = (storage_params *)this;
  ::std::unique_ptr<libtorrent::file_storage,std::default_delete<libtorrent::file_storage>>::
  unique_ptr<std::default_delete<libtorrent::file_storage>,void>
            ((unique_ptr<libtorrent::file_storage,std::default_delete<libtorrent::file_storage>> *)
             &this->m_mapped_files);
  ::std::__cxx11::string::string((string *)&this->m_save_path,(string *)local_18->path);
  stat_cache::stat_cache(&this->m_stat_cache);
  container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  ::container_wrapper(&this->m_file_priority,local_18->priorities);
  container_wrapper<bool,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<bool,_std::allocator<bool>_>_>
  ::container_wrapper(&this->m_use_partfile);
  span<char_const>::span<libtorrent::digest32<160l>,char,void>
            ((span<char_const> *)(local_80 + 8),&local_18->info_hash);
  in.m_len = in_RCX;
  in.m_ptr = (char *)local_70;
  to_hex_abi_cxx11_(&local_68,(aux *)local_80._8_8_,in);
  ::std::operator+(&local_48,".",&local_68);
  ::std::operator+(&this->m_part_file_name,&local_48,".parts");
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::
  unique_ptr<libtorrent::aux::posix_part_file,std::default_delete<libtorrent::aux::posix_part_file>>
  ::unique_ptr<std::default_delete<libtorrent::aux::posix_part_file>,void>
            ((unique_ptr<libtorrent::aux::posix_part_file,std::default_delete<libtorrent::aux::posix_part_file>>
              *)&this->m_part_file);
  if (local_18->mapped_files != (file_storage *)0x0) {
    ::std::make_unique<libtorrent::file_storage,libtorrent::file_storage_const&>
              ((file_storage *)local_80);
    ::std::unique_ptr<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>::
    operator=(&this->m_mapped_files,
              (unique_ptr<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
               *)local_80);
    ::std::unique_ptr<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>::
    ~unique_ptr((unique_ptr<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
                 *)local_80);
  }
  return;
}

Assistant:

posix_storage::posix_storage(storage_params const& p)
		: m_files(p.files)
		, m_save_path(p.path)
		, m_file_priority(p.priorities)
		, m_part_file_name("." + to_hex(p.info_hash) + ".parts")
	{
		if (p.mapped_files) m_mapped_files = std::make_unique<file_storage>(*p.mapped_files);
	}